

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecClass.c
# Opt level: O0

void Cec_ManSimFindBestPattern(Cec_ManSim_t *p)

{
  Vec_Ptr_t *p_00;
  int iVar1;
  int iVar2;
  uint *p_01;
  int local_24;
  int local_20;
  int iPatBest;
  int ScoreBest;
  int i;
  uint *pInfo;
  Cec_ManSim_t *p_local;
  
  local_20 = 0;
  local_24 = 1;
  for (iPatBest = 0; iPatBest < p->nWords * 0x20; iPatBest = iPatBest + 1) {
    if (local_20 < p->pScores[iPatBest]) {
      local_20 = p->pScores[iPatBest];
      local_24 = iPatBest;
    }
  }
  if (p->pBestState->iPo <= local_20) {
    iVar2 = p->pBestState->nRegs;
    iVar1 = Gia_ManRegNum(p->pAig);
    if (iVar2 != iVar1) {
      __assert_fail("p->pBestState->nRegs == Gia_ManRegNum(p->pAig)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecClass.c"
                    ,0x232,"void Cec_ManSimFindBestPattern(Cec_ManSim_t *)");
    }
    iPatBest = 0;
    while( true ) {
      iVar2 = Gia_ManRegNum(p->pAig);
      if (iVar2 <= iPatBest) break;
      p_00 = p->vCiSimInfo;
      iVar2 = Gia_ManPiNum(p->pAig);
      p_01 = (uint *)Vec_PtrEntry(p_00,iVar2 + iPatBest);
      iVar2 = Abc_InfoHasBit((uint *)(p->pBestState + 1),iPatBest);
      iVar1 = Abc_InfoHasBit(p_01,local_24);
      if (iVar2 != iVar1) {
        Abc_InfoXorBit((uint *)(p->pBestState + 1),iPatBest);
      }
      iPatBest = iPatBest + 1;
    }
    p->pBestState->iPo = local_20;
  }
  return;
}

Assistant:

void Cec_ManSimFindBestPattern( Cec_ManSim_t * p )
{ 
    unsigned * pInfo;
    int i, ScoreBest = 0, iPatBest = 1; // set the first pattern
    // find the best pattern
    for ( i = 0; i < 32 * p->nWords; i++ )
        if ( ScoreBest < p->pScores[i] )
        {
            ScoreBest = p->pScores[i];
            iPatBest = i;
        }
    // compare this with the available patterns - and save
    if ( p->pBestState->iPo <= ScoreBest )
    {
        assert( p->pBestState->nRegs == Gia_ManRegNum(p->pAig) );
        for ( i = 0; i < Gia_ManRegNum(p->pAig); i++ )
        {
            pInfo = (unsigned *)Vec_PtrEntry( p->vCiSimInfo, Gia_ManPiNum(p->pAig) + i );
            if ( Abc_InfoHasBit(p->pBestState->pData, i) != Abc_InfoHasBit(pInfo, iPatBest) )
                Abc_InfoXorBit( p->pBestState->pData, i );
        }
        p->pBestState->iPo = ScoreBest;
    }
}